

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcFinalize(void)

{
  int iVar1;
  undefined1 local_30 [8];
  TraceScope traceScope;
  nullres local_9;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    local_9 = '\0';
  }
  else {
    if (nullcFinalize::token == '\0') {
      iVar1 = __cxa_guard_acquire(&nullcFinalize::token);
      if (iVar1 != 0) {
        nullcFinalize::token = NULLC::TraceGetToken("nullc","nullcFinalize");
        __cxa_guard_release(&nullcFinalize::token);
      }
    }
    NULLC::TraceScope::TraceScope((TraceScope *)local_30,nullcFinalize::token);
    NULLC::FinalizeMemory();
    local_9 = '\x01';
    NULLC::TraceScope::~TraceScope((TraceScope *)local_30);
  }
  return local_9;
}

Assistant:

nullres nullcFinalize()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcFinalize");

	FinalizeMemory();

	return 1;
}